

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

long __thiscall FileReader::Read(FileReader *this,void *buffer,long len)

{
  size_t local_28;
  long len_local;
  void *buffer_local;
  FileReader *this_local;
  
  if (-1 < len) {
    if (len < 1) {
      this_local = (FileReader *)0x0;
    }
    else {
      local_28 = len;
      if (this->StartPos + this->Length < this->FilePos + len) {
        local_28 = (this->Length - this->FilePos) + this->StartPos;
      }
      this_local = (FileReader *)fread(buffer,1,local_28,(FILE *)this->File);
      this->FilePos = (long)&(this_local->super_FileReaderBase)._vptr_FileReaderBase + this->FilePos
      ;
    }
    return (long)this_local;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/files.cpp"
                ,0x8e,"virtual long FileReader::Read(void *, long)");
}

Assistant:

long FileReader::Read (void *buffer, long len)
{
	assert(len >= 0);
	if (len <= 0) return 0;
	if (FilePos + len > StartPos + Length)
	{
		len = Length - FilePos + StartPos;
	}
	len = (long)fread (buffer, 1, len, File);
	FilePos += len;
	return len;
}